

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Comparator *pCVar1;
  bool bVar2;
  char *pcVar3;
  Rep *pRVar4;
  TableBuilder *in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string key;
  string handle_encoding;
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  BlockBuilder meta_index_block;
  string local_128;
  Slice local_108;
  undefined1 local_f8 [32];
  BlockHandle local_d8;
  BlockHandle local_c8;
  BlockHandle local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  Logger *local_80;
  _Alloc_hider local_60;
  char local_50 [24];
  Slice local_38;
  
  pRVar4 = in_RSI->rep_;
  Flush(in_RSI);
  if (pRVar4->closed != true) {
    pRVar4->closed = true;
    local_b8.offset_._0_4_ = 0xffffffff;
    local_b8.offset_._4_4_ = 0xffffffff;
    local_b8.size_._0_4_ = 0xffffffff;
    local_b8.size_._4_4_ = 0xffffffff;
    local_c8.offset_._0_4_ = 0xffffffff;
    local_c8.offset_._4_4_ = 0xffffffff;
    local_c8.size_._0_4_ = 0xffffffff;
    local_c8.size_._4_4_ = 0xffffffff;
    local_d8.offset_._0_4_ = 0xffffffff;
    local_d8.offset_._4_4_ = 0xffffffff;
    local_d8.size_._0_4_ = 0xffffffff;
    local_d8.size_._4_4_ = 0xffffffff;
    bVar2 = ok(in_RSI);
    if ((bVar2) && (pRVar4->filter_block != (FilterBlockBuilder *)0x0)) {
      local_a8 = (undefined1  [16])FilterBlockBuilder::Finish(pRVar4->filter_block);
      WriteRawBlock(in_RSI,(Slice *)local_a8,kNoCompression,&local_b8);
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      BlockBuilder::BlockBuilder((BlockBuilder *)local_a8,&pRVar4->options);
      if (pRVar4->filter_block != (FilterBlockBuilder *)0x0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"filter.","");
        (*((pRVar4->options).filter_policy)->_vptr_FilterPolicy[2])();
        std::__cxx11::string::append((char *)&local_128);
        local_f8._8_8_ = (pointer)0x0;
        local_f8[0x10] = '\0';
        local_f8._0_8_ = (Options *)(local_f8 + 0x10);
        BlockHandle::EncodeTo(&local_b8,(string *)local_f8);
        local_108.data_ = local_128._M_dataplus._M_p;
        local_108.size_ = local_128._M_string_length;
        local_38.data_ = (char *)local_f8._0_8_;
        local_38.size_ = local_f8._8_8_;
        BlockBuilder::Add((BlockBuilder *)local_a8,&local_108,&local_38);
        if ((Options *)local_f8._0_8_ != (Options *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
      }
      WriteBlock(in_RSI,(BlockBuilder *)local_a8,&local_c8);
      if (local_60._M_p != local_50) {
        operator_delete(local_60._M_p);
      }
      if (local_80 != (Logger *)0x0) {
        operator_delete(local_80);
      }
      if ((undefined1 *)local_a8._8_8_ != local_98 + 8) {
        operator_delete((void *)local_a8._8_8_);
      }
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      if (pRVar4->pending_index_entry == true) {
        pCVar1 = (pRVar4->options).comparator;
        (*pCVar1->_vptr_Comparator[5])(pCVar1,&pRVar4->last_key);
        local_a8._8_8_ = 0;
        local_a8._0_8_ = (Options *)local_98;
        local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
        BlockHandle::EncodeTo(&pRVar4->pending_handle,(string *)local_a8);
        local_128._M_dataplus._M_p = (pRVar4->last_key)._M_dataplus._M_p;
        local_128._M_string_length = (pRVar4->last_key)._M_string_length;
        local_f8._0_8_ = local_a8._0_8_;
        local_f8._8_8_ = local_a8._8_8_;
        BlockBuilder::Add(&pRVar4->index_block,(Slice *)&local_128,(Slice *)local_f8);
        pRVar4->pending_index_entry = false;
        if ((Options *)local_a8._0_8_ != (Options *)local_98) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      WriteBlock(in_RSI,&pRVar4->index_block,&local_d8);
    }
    bVar2 = ok(in_RSI);
    if (bVar2) {
      local_a8._4_4_ = local_c8.offset_._4_4_;
      local_a8._0_4_ = (undefined4)local_c8.offset_;
      local_a8._12_4_ = local_c8.size_._4_4_;
      local_a8._8_4_ = (undefined4)local_c8.size_;
      local_98._0_8_ = CONCAT44(local_d8.offset_._4_4_,(undefined4)local_d8.offset_);
      local_98._8_8_ = CONCAT44(local_d8.size_._4_4_,(undefined4)local_d8.size_);
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      Footer::EncodeTo((Footer *)local_a8,&local_128);
      local_f8._0_8_ = local_128._M_dataplus._M_p;
      local_f8._8_8_ = local_128._M_string_length;
      (*pRVar4->file->_vptr_WritableFile[2])(&local_108);
      pcVar3 = (pRVar4->status).state_;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_108.data_;
      if (pcVar3 != local_108.data_) {
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.data_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = Status::CopyState(local_108.data_);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_108.data_;
        }
        (pRVar4->status).state_ = pcVar3;
      }
      if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar5);
        pcVar3 = (pRVar4->status).state_;
      }
      if (pcVar3 == (char *)0x0) {
        pRVar4->offset = (uint64_t)(local_128._M_string_length + pRVar4->offset);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
    pcVar3 = (pRVar4->status).state_;
    if (pcVar3 == (char *)0x0) {
      pRVar4 = (Rep *)0x0;
    }
    else {
      pRVar4 = (Rep *)Status::CopyState(pcVar3);
    }
    this->rep_ = pRVar4;
    return (Status)(char *)this;
  }
  __assert_fail("!r->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/table/table_builder.cc"
                ,0xca,"Status leveldb::TableBuilder::Finish()");
}

Assistant:

Status TableBuilder::Finish() {
        Rep *r = rep_;
        Flush();
        assert(!r->closed);
        r->closed = true;

        BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

        // Write filter block
        if (ok() && r->filter_block != NULL) {
            WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                          &filter_block_handle);
        }

        // Write metaindex block
        if (ok()) {
            BlockBuilder meta_index_block(&r->options);
            if (r->filter_block != NULL) {
                // Add mapping from "filter.Name" to location of filter data
                std::string key = "filter.";
                key.append(r->options.filter_policy->Name());
                std::string handle_encoding;
                filter_block_handle.EncodeTo(&handle_encoding);
                meta_index_block.Add(key, handle_encoding);
            }

            // TODO(postrelease): Add stats and other meta blocks
            WriteBlock(&meta_index_block, &metaindex_block_handle);
        }

        // Write index block
        if (ok()) {
            if (r->pending_index_entry) {
                r->options.comparator->FindShortSuccessor(&r->last_key);
                std::string handle_encoding;
                r->pending_handle.EncodeTo(&handle_encoding);
                r->index_block.Add(r->last_key, Slice(handle_encoding));
                r->pending_index_entry = false;
            }
            WriteBlock(&r->index_block, &index_block_handle);
        }

        // Write footer
        if (ok()) {
            Footer footer;
            footer.set_metaindex_handle(metaindex_block_handle);
            footer.set_index_handle(index_block_handle);
            std::string footer_encoding;
            footer.EncodeTo(&footer_encoding);
            r->status = r->file->Append(footer_encoding);
            if (r->status.ok()) {
                r->offset += footer_encoding.size();
            }
        }
        return r->status;
    }